

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_cform.cxx
# Opt level: O2

void __thiscall xray_re::xr_cform::optimize(xr_cform *this)

{
  cf_face_vec *this_00;
  pointer pcVar1;
  bool bVar2;
  __normal_iterator<xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
  _Var3;
  ulong uVar4;
  cf_face *face;
  pointer this_01;
  
  this_00 = &this->m_faces;
  _Var3 = std::
          __remove_if<__gnu_cxx::__normal_iterator<xray_re::cf_face*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>,__gnu_cxx::__ops::_Iter_pred<face_degenerate_pred>>
                    ((this->m_faces).
                     super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl
                     .super__Vector_impl_data._M_start,
                     (this->m_faces).
                     super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl
                     .super__Vector_impl_data._M_finish);
  std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::erase
            (this_00,(const_iterator)_Var3._M_current,
             (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  generate_vertex_faces(this);
  pcVar1 = (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->m_faces).
                 super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                 super__Vector_impl_data._M_start; this_01 != pcVar1; this_01 = this_01 + 1) {
    if ((this_01->field_1).dummy != 0xffffffff) {
      uVar4 = (ulong)(this->m_vertices).
                     super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>.
                     _M_impl.super__Vector_impl_data._M_start[(this_01->field_0).field_0.v[0]].face0
      ;
      while (uVar4 != 0xffffffff) {
        face = (this_00->super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>).
               _M_impl.super__Vector_impl_data._M_start + uVar4;
        if (this_01 < face) {
          bVar2 = cf_face::is_duplicate(this_01,face);
          if (bVar2) {
            (face->field_1).dummy = 0xffffffff;
          }
        }
        uVar4 = cf_face::next_face_idx(face,(ulong)(this_01->field_0).field_0.v[0]);
      }
    }
  }
  _Var3 = std::
          __remove_if<__gnu_cxx::__normal_iterator<xray_re::cf_face*,std::vector<xray_re::cf_face,std::allocator<xray_re::cf_face>>>,__gnu_cxx::__ops::_Iter_pred<face_duplicate_pred>>
                    ((this->m_faces).
                     super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl
                     .super__Vector_impl_data._M_start,
                     (this->m_faces).
                     super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl
                     .super__Vector_impl_data._M_finish);
  std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::erase
            (this_00,(const_iterator)_Var3._M_current,
             (this->m_faces).super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  generate_vertex_faces(this);
  return;
}

Assistant:

void xr_cform::optimize()
{
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), face_degenerate_pred()), m_faces.end());

	generate_vertex_faces();
	for (cf_face_vec_it it = m_faces.begin(), end = m_faces.end(); it != end; ++it) {
		if (it->dummy == BAD_IDX)
			continue;
		for (uint_fast32_t next = m_vertices[it->v0].face0; next != BAD_IDX;) {
			cf_face& face = m_faces[next];
			if (&face > &*it && it->is_duplicate(face))
				face.dummy = BAD_IDX;
			next = face.next_face_idx(it->v0);
		}
	}
//	size_t n = count_if(m_faces.begin(), m_faces.end(), is_duplicate());
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), face_duplicate_pred()), m_faces.end());
//	msg("CFORM optimize: was %"PRIuSIZE", left: %"PRIuSIZE"\n", n, m_faces.size());

	generate_vertex_faces();
}